

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

AddMeshError xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  float fVar1;
  IndexFormat IVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint32_t newBufferSize;
  int iVar8;
  uint uVar9;
  undefined8 *puVar10;
  char *pcVar11;
  uint32_t i;
  ulong uVar12;
  long lVar13;
  AddMeshError AVar14;
  long lVar15;
  uint32_t *puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  float fVar22;
  UvMesh *mesh;
  uint32_t tri [3];
  UvMeshInstance *meshInstance;
  undefined8 *local_68;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  uint local_44 [3];
  undefined8 *local_38;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x2431,"AddMeshError xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[3].chartCount == 0) {
    uVar20 = (ulong)decl->indexCount;
    uVar19 = decl->indexCount;
    if (uVar20 == 0) {
      uVar19 = decl->vertexCount;
    }
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",atlas[4].chartCount,
                 decl->vertexCount,(ulong)uVar19 / 3);
    }
    AVar14 = InvalidIndexCount;
    if (uVar19 * -0x55555555 < 0x55555556) {
      if (uVar19 != 0 && uVar20 != 0) {
        pvVar3 = decl->indexData;
        if (pvVar3 == (void *)0x0) {
LAB_0010ef9f:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x233b,
                        "uint32_t xatlas::DecodeIndex(IndexFormat, const void *, int32_t, uint32_t)"
                       );
        }
        uVar17 = 0;
        do {
          if (decl->indexFormat == UInt16) {
            uVar18 = (uint)(ushort)(*(short *)((long)pvVar3 + uVar17 * 2) + (short)decl->indexOffset
                                   );
          }
          else {
            uVar18 = *(int *)((long)pvVar3 + uVar17 * 4) + decl->indexOffset;
          }
          if (decl->vertexCount <= uVar18) {
            return IndexOutOfRange;
          }
          uVar17 = uVar17 + 1;
        } while (uVar20 != uVar17);
      }
      local_5c = uVar19;
      local_58 = uVar20;
      local_50 = (ulong)uVar19;
      puVar10 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x20);
      if (puVar10 != (undefined8 *)0x0) {
        puVar10[1] = 0;
        puVar10[2] = 0;
        puVar10[3] = 0;
        *(undefined4 *)(puVar10 + 2) = 8;
        *(undefined4 *)(puVar10 + 3) = 0;
        *puVar10 = 0;
        local_38 = puVar10;
        internal::ArrayBase::push_back((ArrayBase *)(atlas + 5),(uint8_t *)&local_38);
        local_68 = (undefined8 *)0x0;
        uVar19 = atlas[4].chartCount;
        if ((ulong)uVar19 != 0) {
          lVar15 = *(long *)&atlas[4].width;
          if (lVar15 == 0) {
            pcVar11 = 
            "T &xatlas::internal::Array<xatlas::internal::UvMesh *>::operator[](uint32_t) [T = xatlas::internal::UvMesh *]"
            ;
            goto LAB_0010ef95;
          }
          uVar20 = 0;
          do {
            puVar10 = *(undefined8 **)(lVar15 + uVar20 * 8);
            iVar8 = bcmp(puVar10,decl,0x30);
            if (iVar8 == 0) {
              local_68 = puVar10;
              if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
                (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
              }
              if (local_68 != (undefined8 *)0x0) goto LAB_0010ef14;
              break;
            }
            uVar20 = uVar20 + 1;
          } while (uVar19 != uVar20);
        }
        puVar10 = (undefined8 *)(*(code *)internal::s_realloc)(0);
        if (puVar10 != (undefined8 *)0x0) {
          memset(puVar10,0,200);
          *(undefined4 *)(puVar10 + 8) = 4;
          *(undefined4 *)(puVar10 + 9) = 0;
          *(undefined4 *)(puVar10 + 0xb) = 4;
          *(undefined4 *)(puVar10 + 0xc) = 0;
          *(undefined4 *)(puVar10 + 0xe) = 4;
          *(undefined4 *)(puVar10 + 0xf) = 0;
          *(undefined4 *)(puVar10 + 0x11) = 8;
          *(undefined4 *)(puVar10 + 0x12) = 0;
          *(undefined4 *)(puVar10 + 0x14) = 8;
          *(undefined4 *)(puVar10 + 0x15) = 0;
          *(undefined4 *)(puVar10 + 0x17) = 4;
          *(undefined4 *)(puVar10 + 0x18) = 0;
          local_68 = puVar10;
          internal::ArrayBase::push_back((ArrayBase *)&atlas[4].width,(uint8_t *)&local_68);
          uVar17 = local_50;
          uVar19 = local_5c;
          pvVar3 = decl->vertexUvData;
          pvVar5 = decl->indexData;
          puVar16 = decl->faceMaterialData;
          uVar6 = *(undefined8 *)&decl->vertexCount;
          uVar7 = *(undefined8 *)&decl->indexOffset;
          *(undefined8 *)((long)local_68 + 0x1c) = *(undefined8 *)&decl->vertexStride;
          *(undefined8 *)((long)local_68 + 0x24) = uVar7;
          local_68[2] = puVar16;
          local_68[3] = uVar6;
          *local_68 = pvVar3;
          local_68[1] = pvVar5;
          puVar16 = decl->faceMaterialData;
          uVar20 = local_58;
          if (puVar16 != (uint32_t *)0x0) {
            uVar18 = decl->indexCount;
            uVar9 = uVar18 / 3;
            *(uint *)((long)local_68 + 0x5c) = uVar18 / 3;
            if (*(uint *)(local_68 + 0xc) < uVar18 / 3) {
              internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_68 + 10),uVar18 / 3);
              puVar16 = decl->faceMaterialData;
              uVar9 = *(uint *)((long)local_68 + 0x5c);
            }
            uVar20 = local_58;
            memcpy((void *)local_68[10],puVar16,(ulong)uVar9 << 2);
          }
          uVar18 = decl->indexCount;
          *(uint *)((long)local_68 + 0x74) = uVar18;
          if (*(uint *)(local_68 + 0xf) < uVar18) {
            internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_68 + 0xd),uVar18);
          }
          if (uVar19 != 0) {
            pvVar3 = decl->indexData;
            IVar2 = decl->indexFormat;
            uVar12 = 0;
            do {
              if (uVar20 == 0) {
                uVar18 = (uint)uVar12;
              }
              else {
                if (pvVar3 == (void *)0x0) goto LAB_0010ef9f;
                if (IVar2 == UInt16) {
                  uVar18 = (uint)(ushort)((short)decl->indexOffset +
                                         *(short *)((long)pvVar3 + uVar12 * 2));
                }
                else {
                  uVar18 = decl->indexOffset + *(int *)((long)pvVar3 + uVar12 * 4);
                }
              }
              if (*(uint *)((long)local_68 + 0x74) <= uVar12) goto LAB_0010ef33;
              if (local_68[0xd] == 0) goto LAB_0010ef4a;
              *(uint *)(local_68[0xd] + uVar12 * 4) = uVar18;
              uVar12 = uVar12 + 1;
            } while (uVar17 != uVar12);
          }
          uVar18 = decl->vertexCount;
          *(uint *)((long)local_68 + 0x8c) = uVar18;
          if (*(uint *)(local_68 + 0x12) < uVar18) {
            internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_68 + 0x10),uVar18);
            uVar18 = decl->vertexCount;
          }
          if (uVar18 != 0) {
            uVar20 = 0;
            do {
              if (*(uint *)((long)local_68 + 0x8c) <= uVar20) goto LAB_0010ef61;
              if (local_68[0x10] == 0) goto LAB_0010ef80;
              *(undefined8 *)(local_68[0x10] + uVar20 * 8) =
                   *(undefined8 *)
                    ((long)decl->vertexUvData + (ulong)(decl->vertexStride * (int)uVar20));
              uVar20 = uVar20 + 1;
            } while (uVar20 < decl->vertexCount);
          }
          uVar18 = decl->indexCount / 3;
          *(uint *)(local_68 + 6) = uVar18;
          uVar18 = uVar18 + 0x1f >> 5;
          *(uint *)((long)local_68 + 0x44) = uVar18;
          if (*(uint *)(local_68 + 9) < uVar18) {
            internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_68 + 7),uVar18);
          }
          if (((void *)local_68[7] != (void *)0x0) && (*(int *)((long)local_68 + 0x44) != 0)) {
            memset((void *)local_68[7],0,
                   (ulong)(uint)(*(int *)((long)local_68 + 0x44) * *(int *)(local_68 + 8)));
          }
          if (2 < uVar19) {
            uVar20 = local_50 * 0xaaaaaaab;
            lVar15 = 0;
            lVar21 = 0;
            uVar17 = 0;
            uVar19 = 0;
            do {
              uVar18 = *(uint *)((long)local_68 + 0x74);
              lVar13 = 0;
              do {
                if ((ulong)uVar18 <= (ulong)(lVar13 + lVar15)) goto LAB_0010ef33;
                if (local_68[0xd] == 0) goto LAB_0010ef4a;
                local_44[lVar13] = *(uint *)(local_68[0xd] + lVar21 + lVar13 * 4);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              uVar18 = *(uint *)((long)local_68 + 0x8c);
              lVar13 = 0;
              do {
                uVar9 = local_44[lVar13];
                if (uVar18 <= uVar9) goto LAB_0010ef61;
                lVar4 = local_68[0x10];
                if (lVar4 == 0) goto LAB_0010ef80;
                if ((NAN(*(float *)(lVar4 + (ulong)uVar9 * 8))) ||
                   (NAN(*(float *)(lVar4 + 4 + (ulong)uVar9 * 8)))) {
                  if ((internal::s_print != (undefined *)0x0 && uVar19 + 1 < 0x33) &&
                     (internal::s_printVerbose == '\x01')) {
                    (*(code *)internal::s_print)("   NAN texture coordinate in vertex %u\n");
                  }
                  goto LAB_0010eec0;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (((uVar18 <= local_44[0]) || (uVar18 <= local_44[1])) || (uVar18 <= local_44[2]))
              goto LAB_0010ef61;
              fVar22 = *(float *)(lVar4 + (ulong)local_44[0] * 8);
              fVar1 = *(float *)(lVar4 + 4 + (ulong)local_44[0] * 8);
              fVar22 = ABS(((*(float *)(lVar4 + 4 + (ulong)local_44[2] * 8) - fVar1) *
                            (*(float *)(lVar4 + (ulong)local_44[1] * 8) - fVar22) -
                           (*(float *)(lVar4 + 4 + (ulong)local_44[1] * 8) - fVar1) *
                           (*(float *)(lVar4 + (ulong)local_44[2] * 8) - fVar22)) * 0.5);
              if (fVar22 <= 1.1920929e-07) {
                if ((internal::s_print != (undefined *)0x0 && uVar19 + 1 < 0x33) &&
                   (internal::s_printVerbose == '\x01')) {
                  (*(code *)internal::s_print)
                            (SUB84((double)fVar22,0),
                             "   Zero area face: %d, indices (%d %d %d), area is %f\n",
                             uVar17 & 0xffffffff);
                }
LAB_0010eec0:
                uVar19 = uVar19 + 1;
                internal::BitArray::set((BitArray *)(local_68 + 6),(uint32_t)uVar17);
              }
              uVar17 = uVar17 + 1;
              lVar21 = lVar21 + 0xc;
              lVar15 = lVar15 + 3;
            } while (uVar17 != uVar20 >> 0x21);
            if ((0x32 < uVar19 && internal::s_print != (undefined *)0x0) &&
               (internal::s_printVerbose == '\x01')) {
              (*(code *)internal::s_print)("   %u additional warnings truncated\n",uVar19 - 0x32);
            }
          }
LAB_0010ef14:
          *local_38 = local_68;
          return Success;
        }
      }
      __assert_fail("size <= 0 || (size > 0 && mem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                    ,0x1ae,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)"
                   );
    }
  }
  else {
    AVar14 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return AVar14;
LAB_0010ef33:
  pcVar11 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0010ef76;
LAB_0010ef4a:
  pcVar11 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0010ef95;
LAB_0010ef80:
  pcVar11 = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
LAB_0010ef95:
  __assert_fail("m_base.buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x480,pcVar11);
LAB_0010ef61:
  pcVar11 = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
LAB_0010ef76:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x47f,pcVar11);
}

Assistant:

AddMeshError AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->meshes.isEmpty()) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->uvMeshInstances.isEmpty())
		internal::s_profile.addMeshRealStart = std::chrono::high_resolution_clock::now();
#endif
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = decl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? decl.indexCount : decl.vertexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	// Create a mesh instance.
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->mesh = nullptr;
	ctx->uvMeshInstances.push_back(meshInstance);
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			mesh = ctx->uvMeshes[m];
			XA_PRINT("   instance of a previous UV mesh\n");
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		ctx->uvMeshes.push_back(mesh);
		mesh->decl = decl;
		if (decl.faceMaterialData) {
			mesh->faceMaterials.resize(decl.indexCount / 3);
			memcpy(mesh->faceMaterials.data(), decl.faceMaterialData, mesh->faceMaterials.size() * sizeof(uint32_t));
		}
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = hasIndices ? DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i) : i;
		mesh->texcoords.resize(decl.vertexCount);
		for (uint32_t i = 0; i < decl.vertexCount; i++)
			mesh->texcoords[i] = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Validate.
		mesh->faceIgnore.resize(decl.indexCount / 3);
		mesh->faceIgnore.zeroOutMemory();
		const uint32_t kMaxWarnings = 50;
		uint32_t warningCount = 0;
		for (uint32_t f = 0; f < indexCount / 3; f++) {
			bool ignore = false;
			uint32_t tri[3];
			for (uint32_t i = 0; i < 3; i++)
				tri[i] = mesh->indices[f * 3 + i];
			// Check for nan UVs.
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = tri[i];
				if (internal::isNan(mesh->texcoords[vertex].x) || internal::isNan(mesh->texcoords[vertex].y)) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   NAN texture coordinate in vertex %u\n", vertex);
					break;
				}
			}
			// Check for zero area faces.
			if (!ignore) {
				const internal::Vector2 &v1 = mesh->texcoords[tri[0]];
				const internal::Vector2 &v2 = mesh->texcoords[tri[1]];
				const internal::Vector2 &v3 = mesh->texcoords[tri[2]];
				const float area = fabsf(((v2.x - v1.x) * (v3.y - v1.y) - (v3.x - v1.x) * (v2.y - v1.y)) * 0.5f);
				if (area <= internal::kAreaEpsilon) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", f, tri[0], tri[1], tri[2], area);
				}
			}
			if (ignore)
				mesh->faceIgnore.set(f);
		}
		if (warningCount > kMaxWarnings)
			XA_PRINT("   %u additional warnings truncated\n", warningCount - kMaxWarnings);
	}
	meshInstance->mesh = mesh;
	XA_PROFILE_END(addMeshCopyData)
	return AddMeshError::Success;
}